

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
mjs::interpreter::impl::impl
          (impl *this,gc_heap *h,version ver,on_statement_executed_type *on_statement_executed)

{
  gc_heap_ptr<mjs::global_object> *h_00;
  bool bVar1;
  global_object *this_00;
  object *this_01;
  undefined8 *puVar2;
  gc_heap_ptr_untyped *p;
  function_object *pfVar3;
  long *plVar4;
  long *plVar5;
  undefined4 in_register_00000014;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  code *local_68;
  code *local_60;
  gc_heap_ptr_untyped local_50;
  object_ptr func_obj;
  
  this->heap_ = h;
  this->strict_mode_ = false;
  (this->active_scope_).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
  (this->active_scope_).super_gc_heap_ptr_untyped.pos_ = 0;
  h_00 = &this->global_;
  global_object::make((gc_heap *)h_00,(version)h,(bool *)CONCAT44(in_register_00000014,ver));
  std::function<void_(const_mjs::statement_&,_const_mjs::completion_&)>::function
            (&this->on_statement_executed_,on_statement_executed);
  this->was_direct_call_to_eval_ = false;
  (this->stack_trace_).super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_trace_).super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->stack_trace_).
           super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->stack_trace_).
           super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->label_set_).
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->label_set_).
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->label_set_).
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->labels_valid_for_ = (statement *)0x0;
  (this->current_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->current_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (global_object *)gc_heap_ptr_untyped::get(&h_00->super_gc_heap_ptr_untyped);
  local_78._8_8_ = 0.0;
  local_60 = std::
             _Function_handler<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp:262:43)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp:262:43)>
             ::_M_manager;
  local_78._0_8_ = this;
  global_object::set_stack_trace_function
            (this_00,(function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_()>
                      *)local_78);
  std::_Function_base::~_Function_base((_Function_base *)local_78);
  this_01 = (object *)gc_heap_ptr_untyped::get(&h_00->super_gc_heap_ptr_untyped);
  local_78._0_8_ = 4;
  local_78._8_8_ = L"eval";
  bVar1 = object::has_property(this_01,(wstring_view *)local_78);
  if (bVar1) {
    __assert_fail("!global_->has_property(L\"eval\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x10a,
                  "mjs::interpreter::impl::impl(gc_heap &, version, const on_statement_executed_type &)"
                 );
  }
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)local_78,&h_00->super_gc_heap_ptr_untyped);
  func_obj.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  put_native_function<mjs::interpreter::impl::impl(mjs::gc_heap&,mjs::version,std::function<void(mjs::statement_const&,mjs::completion_const&)>const&)::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_1_>
            (h_00,(object_ptr *)local_78,"eval",(anon_class_8_1_8991fb9c_for_f *)&func_obj,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_78);
  puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&h_00->super_gc_heap_ptr_untyped);
  local_88._0_8_ = (gc_heap *)0x8;
  local_88._8_8_ = L"Function";
  (**(code **)*puVar2)(local_78,puVar2);
  p = &value::object_value((value *)local_78)->super_gc_heap_ptr_untyped;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&func_obj.super_gc_heap_ptr_untyped,p);
  value::~value((value *)local_78);
  bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>(&func_obj.super_gc_heap_ptr_untyped);
  if (bVar1) {
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&func_obj.super_gc_heap_ptr_untyped);
    local_50.heap_ = (gc_heap *)this;
    gc_heap_ptr_untyped::get(&func_obj.super_gc_heap_ptr_untyped);
    object::class_name((object *)local_78);
    local_88._0_8_ = (gc_heap *)0x0;
    local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
    function_object::
    put_function<mjs::interpreter::impl::impl(mjs::gc_heap&,mjs::version,std::function<void(mjs::statement_const&,mjs::completion_const&)>const&)::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_2_>
              (pfVar3,(anon_class_8_1_8991fb9c_for_f *)&local_50,
               (gc_heap_ptr<mjs::gc_string> *)local_78,(gc_heap_ptr<mjs::gc_string> *)local_88,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_88);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_78);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&func_obj.super_gc_heap_ptr_untyped);
    function_object::default_construct_function(pfVar3);
    plVar4 = (long *)gc_heap_ptr_untyped::get(&h_00->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar4 + 0x60))(local_88,plVar4);
    plVar4 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_88);
    plVar5 = (long *)gc_heap_ptr_untyped::get(&h_00->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar5 + 0x98))(&local_50,plVar5,"constructor");
    value::value((value *)local_78,&func_obj);
    (**(code **)(*plVar4 + 8))(plVar4,&local_50,local_78,2);
    value::~value((value *)local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_88);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)local_88,&h_00->super_gc_heap_ptr_untyped);
    local_50.heap_ = (gc_heap *)0x0;
    local_50.pos_ = 0;
    make_scope((object_ptr *)local_78,(scope_ptr *)local_88);
    gc_heap_ptr_untyped::operator=
              (&(this->active_scope_).super_gc_heap_ptr_untyped,(gc_heap_ptr_untyped *)local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_88);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&func_obj.super_gc_heap_ptr_untyped);
    return;
  }
  __assert_fail("func_obj.has_type<function_object>()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                ,0x12f,
                "mjs::interpreter::impl::impl(gc_heap &, version, const on_statement_executed_type &)"
               );
}

Assistant:

explicit impl(gc_heap& h, version ver, const on_statement_executed_type& on_statement_executed)
        : heap_(h)
        , global_(global_object::make(h, ver, strict_mode_))
        , on_statement_executed_(on_statement_executed) {

        global_->set_stack_trace_function([this]() {
            return stack_trace();
        });

        assert(!global_->has_property(L"eval"));
        put_native_function(global_, global_, "eval", [this](const value&, const std::vector<value>& args) {
            // ES3, 15.1.2.1
            if (args.empty()) {
                return value::undefined;
            } else if (args.front().type() != value_type::string) {
                return args.front();
            }
            std::unique_ptr<block_statement> bs;

            try {
                bs = parse(std::make_shared<source_file>(L"eval", args.front().string_value().view(), global_->language_version()), strict_mode_ ? parse_mode::strict : parse_mode::non_strict);
            } catch (const std::exception&) {
                throw native_error_exception{native_error_type::syntax, stack_trace(), L"Invalid argument to eval"};
            }

            std::unique_ptr<auto_scope> eval_scope;
            if (bs->strict_mode()) {
                eval_scope.reset(new auto_scope{*this, activation_object::make(global_, {}, {}), active_scope_});
            }

            const std::unique_ptr<force_global_scope> fgs{!was_direct_call_to_eval_ ? new force_global_scope{*this} : nullptr};
            hoist(*bs);
            auto c = eval(*bs);
            if (!c) {
                return c.result;
            } else if (c.type == completion_type::throw_) {
                assert(c.result.type() == value_type::object); // FIXME should probably support any value type?
                rethrow_error(c.result.object_value());
            }

            std::wostringstream woss;
            woss << "Illegal " << c.type << " statement";
            throw native_error_exception{native_error_type::syntax, stack_trace(), woss.str()};
        }, 1);

        auto func_obj = global_->get(L"Function").object_value();
        assert(func_obj.has_type<function_object>());
        static_cast<function_object&>(*func_obj).put_function([this](const value&, const std::vector<value>& args) {
            std::wstring body{}, p{};
            if (args.empty()) {
            } else if (args.size() == 1) {
                body = to_string(heap_, args.front()).view();
            } else {
                p = to_string(heap_, args.front()).view();
                for (size_t k = 1; k < args.size() - 1; ++k) {
                    p += ',';
                    p += to_string(heap_, args[k]).view();
                }
                body = to_string(heap_, args.back()).view();
            }

            std::unique_ptr<block_statement> bs;
            try {
                bs = parse(std::make_shared<source_file>(L"Function definition", L"function anonymous(" + p + L") {\n" + body + L"\n}", global_->language_version()), strict_mode_ ? parse_mode::function_constructor_in_strict_context : parse_mode::non_strict);
            } catch (const std::exception&) {
                throw native_error_exception{native_error_type::syntax, stack_trace(), L"Invalid argument to function constructor"};
            }
            if (bs->l().size() != 1 || bs->l().front()->type() != statement_type::function_definition) {
                NOT_IMPLEMENTED("Invalid function definition: " << bs->extend().source_view());
            }

            return value{create_function(static_cast<const function_definition&>(*bs->l().front()), make_scope(global_, nullptr))};
        }, func_obj->class_name().unsafe_raw_get(), nullptr, 1);
        static_cast<function_object&>(*func_obj).default_construct_function();

        global_->function_prototype()->put(global_->common_string("constructor"), value{func_obj}, global_object::default_attributes);

        active_scope_ = make_scope(global_, nullptr);
    }